

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

void __thiscall slang::ast::DeclaredType::checkType(DeclaredType *this,ASTContext *context)

{
  string_view arg;
  string_view arg_00;
  bool bVar1;
  underlying_type uVar2;
  bitwidth_t bVar3;
  FormalArgumentSymbol *this_00;
  Type *in_RDI;
  ImplicitTypeSyntax *in_stack_000000d0;
  ValueSymbol *in_stack_000000d8;
  ASTContext *in_stack_000000e0;
  DeclaredType *in_stack_000000e8;
  Diagnostic *diag;
  RandMode mode;
  span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
  in_stack_00000100;
  VariableSymbol *var;
  NetSymbol *net;
  uint32_t masked;
  LanguageVersion lv;
  Type *in_stack_fffffffffffffe88;
  Type *in_stack_fffffffffffffe90;
  Type *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  bool bVar4;
  SourceLocation in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  DiagCode code;
  Type *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  Diagnostic *diag_00;
  bitmask<slang::ast::MethodFlags> local_ca;
  undefined8 local_c8;
  undefined4 local_bc;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  undefined8 local_98;
  undefined4 local_8c;
  Diagnostic *local_88;
  RandMode local_7c;
  undefined8 local_68;
  VariableSymbol *local_60;
  undefined8 local_58;
  undefined4 local_4c;
  undefined8 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  undefined4 local_2c;
  NetSymbol *local_28;
  bitmask<slang::ast::DeclaredTypeFlags> local_20;
  bitmask<slang::ast::DeclaredTypeFlags> local_1c;
  underlying_type local_18;
  LanguageVersion local_14;
  
  code = SUB84((ulong)in_stack_fffffffffffffeb0 >> 0x20,0);
  ASTContext::getCompilation((ASTContext *)0x10edca1);
  local_14 = Compilation::languageVersion((Compilation *)0x10edca9);
  diag_00 = (Diagnostic *)&(in_RDI->super_Symbol).originatingSyntax;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_20,NeedsTypeCheck);
  local_1c = bitmask<slang::ast::DeclaredTypeFlags>::operator&
                       ((bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe98,
                        (bitmask<slang::ast::DeclaredTypeFlags> *)in_stack_fffffffffffffe90);
  uVar2 = bitmask<slang::ast::DeclaredTypeFlags>::bits(&local_1c);
  local_18 = uVar2;
  if (uVar2 == 0x40) {
    local_28 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0x10edd9c);
    if ((local_28->netType->netKind == UserDefined) ||
       (bVar1 = isValidForNet(in_stack_fffffffffffffec8), bVar1)) {
      bVar3 = Type::getBitWidth(in_stack_fffffffffffffe98);
      if ((bVar3 == 1) && (local_28->expansionHint != None)) {
        local_3c = 0xbf0006;
        local_48 = *(undefined8 *)(*(long *)&in_RDI->super_Symbol + 0x18);
        ASTContext::addDiag((ASTContext *)
                            CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                            in_stack_fffffffffffffea8);
      }
    }
    else {
      local_2c = 0x5c0006;
      local_38 = *(undefined8 *)(*(long *)&in_RDI->super_Symbol + 0x18);
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      ast::operator<<(diag_00,in_RDI);
    }
  }
  else if (uVar2 == 0x80) {
    bVar1 = isValidForUserDefinedNet(in_stack_fffffffffffffec8);
    if (!bVar1) {
      local_4c = 0x690006;
      local_58 = *(undefined8 *)(*(long *)&in_RDI->super_Symbol + 0x18);
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      ast::operator<<(diag_00,in_RDI);
    }
  }
  else if (uVar2 == 0x100) {
    this_00 = Symbol::as<slang::ast::FormalArgumentSymbol>((Symbol *)0x10edef8);
    local_60 = FormalArgumentSymbol::getMergedVariable(this_00);
    if (local_60 != (VariableSymbol *)0x0) {
      slang::syntax::SyntaxNode::as<slang::syntax::ImplicitTypeSyntax>
                ((SyntaxNode *)(in_RDI->super_Symbol).name._M_str);
      local_68 = *(undefined8 *)(*(long *)&in_RDI->super_Symbol + 0x18);
      if ((in_RDI->super_Symbol).location == (SourceLocation)0x0) {
        std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>::span
                  ((span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                    *)0x10edf8f);
      }
      else {
        std::span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>::
        span<const_slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>_&>
                  ((span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
                    *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   (SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffe98);
      }
      mergePortTypes(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                     (SourceLocation)diag,in_stack_00000100);
    }
  }
  else if (uVar2 == 0x200) {
    local_7c = Symbol::getRandMode(&in_stack_fffffffffffffe98->super_Symbol);
    bVar1 = Type::isValidForRand
                      (in_stack_fffffffffffffe98,
                       (RandMode)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                       (LanguageVersion)in_stack_fffffffffffffe90);
    if (!bVar1) {
      local_8c = 0x610006;
      local_98 = *(undefined8 *)(*(long *)&in_RDI->super_Symbol + 0x18);
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      local_88 = ast::operator<<(diag_00,in_RDI);
      if (local_7c == Rand) {
        local_a8 = ::sv((char *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
        arg._M_str = (char *)diag_00;
        arg._M_len = (size_t)in_RDI;
        Diagnostic::operator<<((Diagnostic *)CONCAT44(uVar2,in_stack_fffffffffffffed0),arg);
      }
      else {
        local_b8 = ::sv((char *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
        arg_00._M_str = (char *)diag_00;
        arg_00._M_len = (size_t)in_RDI;
        Diagnostic::operator<<((Diagnostic *)CONCAT44(uVar2,in_stack_fffffffffffffed0),arg_00);
      }
    }
  }
  else if (uVar2 == 0x400) {
    bVar1 = Type::isValidForDPIReturn(in_stack_fffffffffffffe88);
    if (bVar1) {
      Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x10ee172);
      bitmask<slang::ast::MethodFlags>::bitmask(&local_ca,Pure);
      bVar1 = bitmask<slang::ast::MethodFlags>::has
                        ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffe90,
                         (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffe88);
      bVar4 = false;
      if (bVar1) {
        bVar4 = Type::isVoid((Type *)0x10ee1be);
      }
      if (bVar4 != false) {
        ASTContext::addDiag((ASTContext *)CONCAT17(bVar4,in_stack_fffffffffffffea0),code,
                            in_stack_fffffffffffffea8);
      }
    }
    else {
      local_bc = 0x570006;
      local_c8 = *(undefined8 *)(*(long *)&in_RDI->super_Symbol + 0x18);
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      ast::operator<<(diag_00,in_RDI);
    }
  }
  else if (uVar2 == 0x800) {
    bVar1 = Type::isValidForDPIArg((Type *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      ast::operator<<(diag_00,in_RDI);
    }
  }
  else if (uVar2 == 0x2000) {
    bVar1 = Type::isValidForSequence(in_stack_fffffffffffffe90);
    if (!bVar1) {
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      ast::operator<<(diag_00,in_RDI);
    }
  }
  else if (uVar2 == 0x4000) {
    bVar1 = Type::isIntegral(in_stack_fffffffffffffe90);
    if ((!bVar1) && (((int)local_14 < 1 || (bVar1 = Type::isFloating((Type *)0x10ee304), !bVar1))))
    {
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
      ast::operator<<(diag_00,in_RDI);
    }
  }
  else {
    bVar1 = isValidForIfaceVar((Type *)in_stack_fffffffffffffea8);
    if (!bVar1) {
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),code,
                          in_stack_fffffffffffffea8);
    }
  }
  return;
}

Assistant:

void DeclaredType::checkType(const ASTContext& context) const {
    auto lv = context.getCompilation().languageVersion();
    uint32_t masked = (flags & DeclaredTypeFlags::NeedsTypeCheck).bits();
    SLANG_ASSERT(std::popcount(masked) == 1);

    switch (masked) {
        case uint32_t(DeclaredTypeFlags::NetType): {
            auto& net = parent.as<NetSymbol>();
            if (net.netType.netKind != NetType::UserDefined && !isValidForNet(*type))
                context.addDiag(diag::InvalidNetType, parent.location) << *type;
            else if (type->getBitWidth() == 1 && net.expansionHint != NetSymbol::None)
                context.addDiag(diag::SingleBitVectored, parent.location);
            break;
        }
        case uint32_t(DeclaredTypeFlags::UserDefinedNetType):
            if (!isValidForUserDefinedNet(*type))
                context.addDiag(diag::InvalidUserDefinedNetType, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::FormalArgMergeVar):
            if (auto var = parent.as<FormalArgumentSymbol>().getMergedVariable()) {
                SLANG_ASSERT(!hasLink);
                SLANG_ASSERT(typeOrLink.typeSyntax);
                mergePortTypes(context, *var, typeOrLink.typeSyntax->as<ImplicitTypeSyntax>(),
                               parent.location,
                               dimensions ? *dimensions
                                          : std::span<const VariableDimensionSyntax* const>{});
            }
            break;
        case uint32_t(DeclaredTypeFlags::Rand): {
            RandMode mode = parent.getRandMode();
            if (!type->isValidForRand(mode, lv)) {
                auto& diag = context.addDiag(diag::InvalidRandType, parent.location) << *type;
                if (mode == RandMode::Rand)
                    diag << "rand"sv;
                else
                    diag << "randc"sv;
            }
            break;
        }
        case uint32_t(DeclaredTypeFlags::DPIReturnType): {
            if (!type->isValidForDPIReturn())
                context.addDiag(diag::InvalidDPIReturnType, parent.location) << *type;
            else if (parent.as<SubroutineSymbol>().flags.has(MethodFlags::Pure) && type->isVoid())
                context.addDiag(diag::DPIPureReturn, parent.location);
            break;
        }
        case uint32_t(DeclaredTypeFlags::DPIArg):
            if (!type->isValidForDPIArg())
                context.addDiag(diag::InvalidDPIArgType, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::RequireSequenceType):
            if (!type->isValidForSequence())
                context.addDiag(diag::AssertionExprType, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::CoverageType):
            if (!type->isIntegral() && (lv < LanguageVersion::v1800_2023 || !type->isFloating()))
                context.addDiag(diag::InvalidCoverageExpr, parent.location) << *type;
            break;
        case uint32_t(DeclaredTypeFlags::InterfaceVariable):
            if (!isValidForIfaceVar(*type))
                context.addDiag(diag::VirtualInterfaceIfaceMember, parent.location);
            break;
        default:
            SLANG_UNREACHABLE;
    }
}